

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.h
# Opt level: O0

Ray * __thiscall
PerspectiveCamera::generateRay(Ray *__return_storage_ptr__,PerspectiveCamera *this,Vector2f *point)

{
  float *pfVar1;
  double dVar2;
  Vector3f local_6c;
  Vector3f local_60;
  Vector3f local_54;
  Vector3f local_48;
  Vector3f local_3c;
  undefined1 local_30 [8];
  Vector3f newDir;
  float d;
  Vector2f *point_local;
  PerspectiveCamera *this_local;
  
  unique0x1000013b = point;
  dVar2 = std::tan((double)(ulong)(uint)(this->_angle / 2.0));
  newDir.m_elements[1] = 1.0 / SUB84(dVar2,0);
  ::operator*(newDir.m_elements[1],&local_48);
  pfVar1 = Vector2f::operator[](stack0xffffffffffffffe0,0);
  ::operator*(*pfVar1,&local_54);
  operator+(&local_3c,&local_48);
  pfVar1 = Vector2f::operator[](stack0xffffffffffffffe0,1);
  ::operator*(*pfVar1,&local_60);
  operator+((Vector3f *)local_30,&local_3c);
  Vector3f::normalized(&local_6c);
  Vector3f::operator=((Vector3f *)local_30,&local_6c);
  Ray::Ray(__return_storage_ptr__,&this->_center,(Vector3f *)local_30);
  return __return_storage_ptr__;
}

Assistant:

Ray generateRay(const Vector2f &point) override {
        // BEGIN STARTER
        float d = 1.0f / (float) std::tan(_angle / 2.0f);
        Vector3f newDir = d * _direction + point[0] * _horizontal + point[1] * _up;
        newDir = newDir.normalized();

        return Ray(_center, newDir);
        // END STARTER
    }